

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O1

void __thiscall
biosoup::test::BiosoupTimerTest_Stop_Test::TestBody(BiosoupTimerTest_Stop_Test *this)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  AssertHelper local_60;
  Message local_58;
  undefined8 *local_50;
  string local_48;
  double local_28;
  undefined8 uStack_20;
  
  local_68.data_._0_4_ = 0;
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_48,"0","t.elapsed_time()",(int *)&local_68,(double *)&local_58);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x1e,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_58.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)local_48._M_string_length);
  }
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar5 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
    if (iVar5 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if (lVar6 == 0) {
    local_28 = 0.0;
  }
  else {
    lVar8 = std::chrono::_V2::steady_clock::now();
    local_28 = (double)(lVar8 - lVar6) / 1000000000.0 + 0.0;
  }
  uStack_20 = 0;
  local_48._M_dataplus._M_p = (char *)0x0;
  local_48._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar5 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
    if (iVar5 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  bVar1 = local_28 <= 0.384;
  bVar2 = 0.256 <= local_28;
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = bVar2 && bVar1;
  local_50 = (undefined8 *)0x0;
  if (!bVar2 || !bVar1) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.elapsed_time())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x23,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
  }
  puVar4 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar4);
  }
  local_50 = (undefined8 *)0x0;
  if (!bVar2 || !bVar1) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.elapsed_time())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x25,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
  }
  puVar4 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar4);
  }
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_48._M_dataplus._M_p = (char *)0x0;
  local_48._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar5 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
    if (iVar5 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if (lVar6 == 0) {
    dVar3 = 0.0;
  }
  else {
    lVar8 = std::chrono::_V2::steady_clock::now();
    dVar3 = (double)(lVar8 - lVar6) / 1000000000.0;
    local_28 = local_28 + dVar3;
  }
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = dVar3 <= 0.384 && 0.256 <= dVar3;
  local_50 = (undefined8 *)0x0;
  if (dVar3 > 0.384 || 0.256 > dVar3) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.Stop())","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x28,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
  }
  puVar4 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar4);
  }
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = local_28 <= 0.768 && 0.512 <= local_28;
  local_50 = (undefined8 *)0x0;
  if (local_28 > 0.768 || 0.512 > local_28) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,
               (AssertionResult *)"ExpectWithinInclusive(0.512, 0.768, t.elapsed_time())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x29,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
    }
  }
  puVar4 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar4);
  }
  return;
}

Assistant:

TEST(BiosoupTimerTest, Stop) {
  Timer t{};
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_EQ(0, t.elapsed_time());
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Stop();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.512, 0.768, t.elapsed_time()));
}